

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

void beagle_library_finalize(void)

{
  vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *pvVar1;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *plVar2;
  list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *plVar3;
  
  plVar3 = plugins_abi_cxx11_;
  if (loaded != 0 &&
      plugins_abi_cxx11_ !=
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    std::__cxx11::_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
    _M_clear(&plugins_abi_cxx11_->
              super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>)
    ;
    operator_delete(plVar3);
  }
  plVar2 = implFactory_abi_cxx11_;
  if (loaded != 0 &&
      implFactory_abi_cxx11_ !=
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    std::__cxx11::
    _List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::_M_clear
              (&implFactory_abi_cxx11_->
                super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
              );
    operator_delete(plVar2);
  }
  if (loaded != 0 && rsrcList != (BeagleResourceList *)0x0) {
    free(rsrcList->list);
    free(rsrcList);
  }
  if ((rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) && (loaded != 0)) {
    free(rsrcBenchList->list);
    free(rsrcBenchList);
  }
  pvVar1 = instances;
  if ((instances != (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)0x0) &&
     (loaded != 0)) {
    std::_Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>::~_Vector_base
              (&instances->
                super__Vector_base<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>);
    operator_delete(pvVar1);
  }
  loaded = 0;
  return;
}

Assistant:

void beagle_library_finalize(void) {
  DEBUG_FINALIZE_TIME();
    // FIXME: need to destroy each plugin
    // the following code segfaults
/*  std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins.begin();
    for(; plugin_iter != plugins.end(); plugin_iter++ ){
        delete *plugin_iter;
    }
    plugins.clear();
*/

    if(plugins!=NULL && loaded){
        delete plugins;
    }
    // Destroy implFactory.
    // The contained factory pointers will be deleted by the plugins themselves
    if (implFactory && loaded) {
        try {
        delete implFactory;
        } catch (...) {

        }
    }

    // Destroy rsrcList
    // The resources will be deleted by the plugins themselves
    if (rsrcList && loaded) {
        free(rsrcList->list);
        free(rsrcList);
    }

    if (rsrcBenchList && loaded) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }


    // Destroy instances
    if (instances && loaded) {
        delete instances;
    }
    loaded = 0;
}